

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void keyscan_break(tgestate_t *state)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  
  bVar1 = (*state->speccy->in)(state->speccy,0x7ffe);
  bVar2 = (*state->speccy->in)(state->speccy,0xfefe);
  if (((bVar2 | bVar1) & 1) != 0) {
    return;
  }
  screen_reset(state);
  iVar3 = user_confirm(state);
  if (iVar3 == 0) {
    reset_game(state);
  }
  else if (state->room_index == '\0') {
    reset_outdoors(state);
    return;
  }
  enter_room(state);
}

Assistant:

void keyscan_break(tgestate_t *state)
{
  int space;
  int shift;

  assert(state != NULL);

  /* Is shift-space (break) pressed? */
  space = (state->speccy->in(state->speccy, port_KEYBOARD_SPACESYMSHFTMNB) & 1) == 0;
  shift = (state->speccy->in(state->speccy, port_KEYBOARD_SHIFTZXCV)       & 1) == 0;
  if (!space || !shift)
    return; /* not pressed */

  screen_reset(state);
  if (user_confirm(state) == 0)
  {
    reset_game(state);
    NEVER_RETURNS;
  }

  if (state->room_index == room_0_OUTDOORS)
  {
    reset_outdoors(state);
  }
  else
  {
    enter_room(state); /* doesn't return (jumps to main_loop) */
    NEVER_RETURNS;
  }
}